

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var cs_impl::runtime_cs_ext::source_import(context_t *context,string *path)

{
  cs::instance_type::source_import
            ((instance_type *)&stack0xffffffffffffffe0,*(string **)((path->_M_dataplus)._M_p + 0x10)
            );
  cs::make_namespace((cs *)context,(namespace_t *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return (var)(proxy *)context;
}

Assistant:

var source_import(const context_t &context, const string &path)
		{
			try {
				return make_namespace(context->instance->source_import(path));
			}
			catch (...) {
				return null_pointer;
			}
		}